

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-algebra.cc
# Opt level: O1

quatf tinyusdz::slerp(quatf *a,quatf *b,float t)

{
  vec<float,_4> vVar1;
  quatf qVar2;
  vec<float,_4> local_28;
  vec<float,_4> local_18;
  
  local_18.x = (a->imag)._M_elems[0];
  local_18.y = (a->imag)._M_elems[1];
  local_18._8_8_ = *(undefined8 *)((a->imag)._M_elems + 2);
  local_28.x = (b->imag)._M_elems[0];
  local_28.y = (b->imag)._M_elems[1];
  local_28._8_8_ = *(undefined8 *)((b->imag)._M_elems + 2);
  vVar1 = linalg::slerp<float,4>(&local_18,&local_28,t);
  qVar2.imag._M_elems[0] = vVar1.x;
  qVar2.imag._M_elems[1] = vVar1.y;
  qVar2.imag._M_elems[2] = vVar1.z;
  qVar2.real = vVar1.w;
  return qVar2;
}

Assistant:

value::quatf slerp(const value::quatf &a, const value::quatf &b, const float t) {
  linalg::vec<float, 4> qa;    
  linalg::vec<float, 4> qb;    
  linalg::vec<float, 4> qret;    

  memcpy(reinterpret_cast<value::quatf *>(&qa), &a, sizeof(float) * 4);
  memcpy(reinterpret_cast<value::quatf *>(&qb), &b, sizeof(float) * 4);

  qret = linalg::slerp(qa, qb, t);
  
  value::quatf ret;
  memcpy(&ret, reinterpret_cast<value::quatf *>(&qret), sizeof(float) * 4);
  return ret;
}